

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

bool cmState::StringToCacheEntryType(string *s,CacheEntryType *type)

{
  __type _Var1;
  size_t i;
  ulong uVar2;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL> *__rhs
  ;
  
  __rhs = &cmCacheEntryTypes_abi_cxx11_;
  uVar2 = 0;
  do {
    if (uVar2 == 7) {
LAB_001b6e99:
      return uVar2 < 7;
    }
    _Var1 = std::operator==(s,__rhs->_M_elems);
    if (_Var1) {
      *type = (CacheEntryType)uVar2;
      goto LAB_001b6e99;
    }
    uVar2 = uVar2 + 1;
    __rhs = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL>
             *)((long)__rhs + 0x20);
  } while( true );
}

Assistant:

bool cmState::StringToCacheEntryType(const std::string& s,
                                     cmStateEnums::CacheEntryType& type)
{
  for (size_t i = 0; i < cmCacheEntryTypes.size(); ++i) {
    if (s == cmCacheEntryTypes[i]) {
      type = static_cast<cmStateEnums::CacheEntryType>(i);
      return true;
    }
  }
  return false;
}